

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O1

void __thiscall
UnitTests::Assert::
ContainmentError<int,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (Assert *this,string *msg,string *msg2,int value,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  ostream *poVar1;
  ostringstream s;
  true_type local_1c9;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (msg->_M_string_length != 0) {
    local_1c8._M_dataplus._M_p = (pointer)msg;
    poVar1 = details::operator<<((ostream *)local_1a8,
                                 (expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,". ",2);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(msg2->_M_dataplus)._M_p,msg2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::operator<<((ostream *)local_1a8,value);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,", actual contents :\n\t",0x15);
  local_1c8._M_dataplus._M_p = (pointer)begin._M_current;
  local_1c8._M_string_length = (size_type)end._M_current;
  stream_any_details::
  output_range_or_type<UnitTests::Assert::Range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            ((ostream *)local_1a8,
             (Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_> *
             )&local_1c8,&local_1c9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__cxx11::stringbuf::str();
  Error(this,&local_1c8);
}

Assistant:

[[noreturn]] void ContainmentError(const std::string& msg, const std::string& msg2, Value value,
            ContainerIterator begin, ContainerIterator end) const {
            auto s = std::ostringstream{};
            if (!msg.empty())
                s << stream(msg) << ". ";

            s << msg2 << " ";
            s << stream(value);
            s << ", actual contents :\n\t";
            s << stream_any(Range<ContainerIterator>(begin, end));
            s << "\n";
            Error(s.str());
        }